

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O1

void pnga_msg_brdcst(Integer type,void *buffer,Integer len,Integer root)

{
  uint uVar1;
  Integer IVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  dVar6 = ceil((double)len / 2147483647.0);
  iVar3 = (int)dVar6;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      lVar4 = len - lVar5;
      if (lVar5 + 0x7fffffff <= len) {
        lVar4 = 0x7fffffff;
      }
      IVar2 = pnga_pgroup_get_default();
      if ((int)(uint)IVar2 < 1) {
        armci_msg_bcast((void *)((long)buffer + lVar5),(int)lVar4,(int)root);
      }
      else {
        uVar1 = (uint)IVar2 & 0x7fffffff;
        armci_msg_group_bcast_scope
                  (0x14d,(void *)((long)buffer + lVar5),(int)lVar4,
                   PGRP_LIST[uVar1].inv_map_proc_list[root],&PGRP_LIST[uVar1].group);
      }
      lVar5 = lVar5 + lVar4;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void pnga_msg_brdcst(Integer type, void *buffer, Integer len, Integer root)
{
  long bigint = 2147483647L;
  int i, nsteps;//= (int) ceil(((double)len)/((double)bigint));
  long len_small;
  void *buffer_ptr;
  long istart=0;
  int p_grp;
  /*          printf("%ld len %ld bigint %ld  \n",GAme,len,bigint); */
    nsteps = (int) ceil(((double)len)/((double)bigint));
    /*          printf("%ld len %ld bigint %ld  nsteps %d \n",GAme,len,bigint,nsteps); */
  for (i=0; i < nsteps; i++){
    len_small=bigint;
    buffer_ptr=(char *)buffer+istart;
    if (istart+len_small > len) len_small=((long)(len - istart));
    /*               printf("%ld step %d of %d  len= %d total=%ld istart= %ld\n",GAme,(i+1),nsteps,len_small,len,istart); */
    p_grp = (int)pnga_pgroup_get_default();
    if (p_grp > 0) {
#   ifdef MSG_COMMS_MPI
        int aroot = PGRP_LIST[p_grp].inv_map_proc_list[root];
        armci_msg_group_bcast_scope(SCOPE_ALL,buffer_ptr, (int)len_small, aroot,(&(PGRP_LIST[p_grp].group)));
#   endif
    } else {
      armci_msg_bcast(buffer_ptr, (int)len_small, (int)root);
    }
    istart+=len_small;
  }
}